

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlibraryinfo.cpp
# Opt level: O2

unique_ptr<QSettings,_std::default_delete<QSettings>_> findConfiguration(void)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  bool bVar4;
  Format *pFVar5;
  __uniq_ptr_data<QSettings,_std::default_delete<QSettings>,_true,_true> in_RDI;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_c8;
  QStringBuilder<QString_&,_QString> local_a8;
  QArrayDataPointer<char16_t> local_88;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((anonymous_namespace)::qtconfManualPath != (Format *)0x0) {
    local_a8.a = (QString *)CONCAT44(local_a8.a._4_4_,1);
    std::make_unique<QSettings,QString_const&,QSettings::Format>
              ((QString *)
               in_RDI.super___uniq_ptr_impl<QSettings,_std::default_delete<QSettings>_>._M_t.
               super__Tuple_impl<0UL,_QSettings_*,_std::default_delete<QSettings>_>.
               super__Head_base<0UL,_QSettings_*,_false>._M_head_impl,
               (anonymous_namespace)::qtconfManualPath);
    goto LAB_001fb80a;
  }
  local_48.d = (Data *)0x0;
  local_a8.a = (QString *)0x0;
  local_a8.b.d.d = (Data *)0x0;
  local_48.ptr = L":/qt/etc/qt.conf";
  local_a8.b.d.ptr = (char16_t *)0x0;
  local_48.size = 0x10;
  pFVar5 = (anonymous_namespace)::qtconfManualPath;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a8);
  QLocale::c(&local_68,pFVar5);
  QResource::QResource((QResource *)&local_a8,(QString *)&local_48,(QLocale *)&local_68);
  bVar4 = QResource::isValid((QResource *)&local_a8);
  QResource::~QResource((QResource *)&local_a8);
  QLocale::~QLocale((QLocale *)&local_68);
  if (bVar4) {
    local_a8.a = (QString *)CONCAT44(local_a8.a._4_4_,1);
    std::make_unique<QSettings,QString&,QSettings::Format>
              ((QString *)
               in_RDI.super___uniq_ptr_impl<QSettings,_std::default_delete<QSettings>_>._M_t.
               super__Tuple_impl<0UL,_QSettings_*,_std::default_delete<QSettings>_>.
               super__Head_base<0UL,_QSettings_*,_false>._M_head_impl,(Format *)&local_48);
  }
  else {
    bVar4 = QCoreApplication::instanceExists();
    if (bVar4) {
      local_68.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_68.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_68.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      QCoreApplication::applicationDirPath();
      Qt::Literals::StringLiterals::operator____s((QString *)&local_c8,L"/qt6.conf",9);
      local_a8.b.d.size = local_c8.size;
      local_a8.b.d.ptr = local_c8.ptr;
      local_a8.b.d.d = local_c8.d;
      local_c8.d = (Data *)0x0;
      local_c8.ptr = (char16_t *)0x0;
      local_c8.size = 0;
      local_a8.a = (QString *)&local_68;
      QStringBuilder<QString_&,_QString>::convertTo<QString>((QString *)&local_88,&local_a8);
      qVar3 = local_48.size;
      pcVar2 = local_48.ptr;
      pDVar1 = local_48.d;
      local_48.d = local_88.d;
      local_48.ptr = local_88.ptr;
      local_88.d = pDVar1;
      local_88.ptr = pcVar2;
      local_48.size = local_88.size;
      local_88.size = qVar3;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8.b.d);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
      bVar4 = QFile::exists((QString *)&local_48);
      if (bVar4) {
        local_a8.a = (QString *)CONCAT44(local_a8.a._4_4_,1);
        std::make_unique<QSettings,QString&,QSettings::Format>
                  ((QString *)
                   in_RDI.super___uniq_ptr_impl<QSettings,_std::default_delete<QSettings>_>._M_t.
                   super__Tuple_impl<0UL,_QSettings_*,_std::default_delete<QSettings>_>.
                   super__Head_base<0UL,_QSettings_*,_false>._M_head_impl,(Format *)&local_48);
      }
      else {
        local_88.ptr = L"/qt.conf";
        local_88.d = (Data *)&local_68;
        QStringBuilder<QString_&,_const_char16_t_(&)[9]>::convertTo<QString>
                  ((QString *)&local_a8,
                   (QStringBuilder<QString_&,_const_char16_t_(&)[9]> *)&local_88);
        qVar3 = local_48.size;
        pcVar2 = local_48.ptr;
        pDVar1 = local_48.d;
        local_48.d = (Data *)local_a8.a;
        local_48.ptr = (char16_t *)local_a8.b.d.d;
        local_a8.a = (QString *)pDVar1;
        local_a8.b.d.d = (Data *)pcVar2;
        local_48.size = (qsizetype)local_a8.b.d.ptr;
        local_a8.b.d.ptr = (char16_t *)qVar3;
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a8);
        bVar4 = QFile::exists((QString *)&local_48);
        if (!bVar4) {
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
          goto LAB_001fb7f9;
        }
        local_a8.a = (QString *)CONCAT44(local_a8.a._4_4_,1);
        std::make_unique<QSettings,QString&,QSettings::Format>
                  ((QString *)
                   in_RDI.super___uniq_ptr_impl<QSettings,_std::default_delete<QSettings>_>._M_t.
                   super__Tuple_impl<0UL,_QSettings_*,_std::default_delete<QSettings>_>.
                   super__Head_base<0UL,_QSettings_*,_false>._M_head_impl,(Format *)&local_48);
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
    }
    else {
LAB_001fb7f9:
      *(undefined8 *)
       in_RDI.super___uniq_ptr_impl<QSettings,_std::default_delete<QSettings>_>._M_t.
       super__Tuple_impl<0UL,_QSettings_*,_std::default_delete<QSettings>_>.
       super__Head_base<0UL,_QSettings_*,_false>._M_head_impl = 0;
    }
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
LAB_001fb80a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (__uniq_ptr_data<QSettings,_std::default_delete<QSettings>,_true,_true>)
           (tuple<QSettings_*,_std::default_delete<QSettings>_>)
           in_RDI.super___uniq_ptr_impl<QSettings,_std::default_delete<QSettings>_>._M_t.
           super__Tuple_impl<0UL,_QSettings_*,_std::default_delete<QSettings>_>.
           super__Head_base<0UL,_QSettings_*,_false>._M_head_impl;
  }
  __stack_chk_fail();
}

Assistant:

static std::unique_ptr<QSettings> findConfiguration()
{
    if (qtconfManualPath)
        return std::make_unique<QSettings>(*qtconfManualPath, QSettings::IniFormat);

    QString qtconfig = QStringLiteral(":/qt/etc/qt.conf");
    if (QResource(qtconfig, QLocale::c()).isValid())
        return std::make_unique<QSettings>(qtconfig, QSettings::IniFormat);
#ifdef Q_OS_DARWIN
    CFBundleRef bundleRef = CFBundleGetMainBundle();
    if (bundleRef) {
        QCFType<CFURLRef> urlRef = CFBundleCopyResourceURL(bundleRef,
                                                           QCFString("qt.conf"_L1),
                                                           0,
                                                           0);
        if (urlRef) {
            QCFString path = CFURLCopyFileSystemPath(urlRef, kCFURLPOSIXPathStyle);
            qtconfig = QDir::cleanPath(path);
            if (QFile::exists(qtconfig))
                return std::make_unique<QSettings>(qtconfig, QSettings::IniFormat);
        }
    }
#endif
    if (QCoreApplication::instanceExists()) {
        QString pwd = QCoreApplication::applicationDirPath();
        qtconfig = pwd + u"/qt" QT_STRINGIFY(QT_VERSION_MAJOR) ".conf"_s;
        if (QFile::exists(qtconfig))
            return std::make_unique<QSettings>(qtconfig, QSettings::IniFormat);
        qtconfig = pwd + u"/qt.conf";
        if (QFile::exists(qtconfig))
            return std::make_unique<QSettings>(qtconfig, QSettings::IniFormat);
    }
    return nullptr;     //no luck
}